

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSeparator.cpp
# Opt level: O2

void __thiscall
HighsSeparator::run(HighsSeparator *this,HighsLpRelaxation *lpRelaxation,
                   HighsLpAggregator *lpAggregator,HighsTransformedLp *transLp,HighsCutPool *cutpool
                   )

{
  HighsInt HVar1;
  HighsInt HVar2;
  
  this->numCalls = this->numCalls + 1;
  HVar1 = HighsCutPool::getNumCuts(cutpool);
  HighsTimer::start(&lpRelaxation->mipsolver->timer_,this->clockIndex);
  (**this->_vptr_HighsSeparator)(this,lpRelaxation,lpAggregator,transLp,cutpool);
  HighsTimer::stop(&lpRelaxation->mipsolver->timer_,this->clockIndex);
  HVar2 = HighsCutPool::getNumCuts(cutpool);
  this->numCutsFound = this->numCutsFound + (HVar2 - HVar1);
  return;
}

Assistant:

void HighsSeparator::run(HighsLpRelaxation& lpRelaxation,
                         HighsLpAggregator& lpAggregator,
                         HighsTransformedLp& transLp, HighsCutPool& cutpool) {
  ++numCalls;
  HighsInt currNumCuts = cutpool.getNumCuts();

  lpRelaxation.getMipSolver().timer_.start(clockIndex);
  separateLpSolution(lpRelaxation, lpAggregator, transLp, cutpool);
  lpRelaxation.getMipSolver().timer_.stop(clockIndex);

  numCutsFound += cutpool.getNumCuts() - currNumCuts;
}